

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

bool __thiscall
doctest::detail::decomp_assert(detail *this,Enum at,char *file,int line,char *expr,Result *result)

{
  byte bVar1;
  code *pcVar2;
  char extraout_AL;
  undefined1 uVar3;
  bool bVar4;
  undefined4 in_register_0000000c;
  Enum at_00;
  undefined4 in_register_00000034;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  ResultBuilder rb;
  ResultBuilder local_88;
  
  local_88.super_AssertData.m_file = (char *)CONCAT44(in_register_00000034,at);
  local_88.super_AssertData.m_line = (int)file;
  local_88.super_AssertData.m_expr = (char *)CONCAT44(in_register_0000000c,line);
  bVar1 = *expr;
  local_88.super_AssertData.m_failed = (bool)(bVar1 ^ 1);
  at_00 = (Enum)this;
  local_88.super_AssertData.m_at = at_00;
  if (is_running_in_test == '\0') {
    if (bVar1 != 0) {
      return (bool)bVar1;
    }
    local_88.super_AssertData.m_exception.field_0.buf[0] = '\0';
    local_88.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    local_88.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    local_88.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    local_88.super_AssertData.m_test_case = *(TestCaseData **)(g_cs + 0x20);
    local_88.super_AssertData.m_threw = false;
    local_88.super_AssertData.m_threw_as = false;
    local_88.super_AssertData.m_exception_type = "";
    local_88.super_AssertData.m_exception_string = "";
    String::operator=(&local_88.super_AssertData.m_decomp,(String *)(expr + 8));
    if (*(code **)(g_cs + 0x10e8) == (code *)0x0) {
      abort();
    }
    (**(code **)(g_cs + 0x10e8))(&local_88);
    bVar4 = isDebuggerActive();
    if ((bVar4) && (*(char *)(g_cs + 0x79) == '\0')) {
      pcVar2 = (code *)swi(3);
      uVar3 = (*pcVar2)();
      return (bool)uVar3;
    }
    bVar4 = checkIfShouldThrow(at_00);
    if (bVar4) {
      throwException();
    }
  }
  else {
    local_88.super_AssertData.m_exception.field_0.buf[0] = '\0';
    local_88.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    local_88.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    local_88.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    local_88.super_AssertData.m_test_case = *(TestCaseData **)(g_cs + 0x20);
    local_88.super_AssertData.m_threw = false;
    local_88.super_AssertData.m_threw_as = false;
    local_88.super_AssertData.m_exception_type = "";
    local_88.super_AssertData.m_exception_string = "";
    if ((bVar1 == 0) || (*(char *)(g_cs + 0x6c) == '\x01')) {
      String::operator=(&local_88.super_AssertData.m_decomp,(String *)(expr + 8));
      in_XMM0_Qa = extraout_XMM0_Qa;
    }
    ResultBuilder::log(&local_88,in_XMM0_Qa);
    if (extraout_AL != '\0') {
      pcVar2 = (code *)swi(3);
      uVar3 = (*pcVar2)();
      return (bool)uVar3;
    }
    if ((local_88.super_AssertData.m_failed == true) && (bVar4 = checkIfShouldThrow(at_00), bVar4))
    {
      throwException();
    }
  }
  if ((local_88.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_88.super_AssertData.m_decomp.field_0._1_7_,
                       local_88.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_88.super_AssertData.m_decomp.field_0._1_7_,
                                       local_88.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_88.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_88.super_AssertData.m_exception.field_0._1_7_,
                       local_88.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_88.super_AssertData.m_exception.field_0._1_7_,
                                       local_88.super_AssertData.m_exception.field_0.buf[0]));
  }
  return (bool)bVar1;
}

Assistant:

bool decomp_assert(assertType::Enum at, const char* file, int line, const char* expr,
                       Result result) {
        bool failed = !result.m_passed;

        // ###################################################################################
        // IF THE DEBUGGER BREAKS HERE - GO 1 LEVEL UP IN THE CALLSTACK FOR THE FAILING ASSERT
        // THIS IS THE EFFECT OF HAVING 'DOCTEST_CONFIG_SUPER_FAST_ASSERTS' DEFINED
        // ###################################################################################
        DOCTEST_ASSERT_OUT_OF_TESTS(result.m_decomp);
        DOCTEST_ASSERT_IN_TESTS(result.m_decomp);
        // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
        return !failed;
    }